

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_ManPrintSolutions(Emb_Man_t *p,int nSols)

{
  int iVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  
  if (0 < nSols) {
    iVar3 = 0;
    do {
      iVar1 = p->nObjs;
      if (0 < iVar1) {
        pfVar2 = p->pSols;
        lVar4 = 0;
        do {
          printf("%4d ",(ulong)(uint)(int)(pfVar2[iVar1 * iVar3 + lVar4] * 100.0));
          lVar4 = lVar4 + 1;
        } while (lVar4 < p->nObjs);
      }
      putchar(10);
      iVar3 = iVar3 + 1;
    } while (iVar3 != nSols);
  }
  return;
}

Assistant:

void Emb_ManPrintSolutions( Emb_Man_t * p, int nSols )
{
    float * pSol;
    int i, k;
    for ( i = 0; i < nSols; i++ )
    {
        pSol = Emb_ManSol( p, i );
        for ( k = 0; k < p->nObjs; k++ )
            printf( "%4d ", (int)(100 * pSol[k]) );
        printf( "\n" );
    }
}